

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::AddRibosome(Model *this,int footprint,double speed,int copy_number)

{
  SpeciesTracker *this_00;
  Polymerase pol;
  allocator local_c1;
  double local_c0;
  string local_b8;
  MobileElement local_98;
  
  local_c0 = speed;
  std::__cxx11::string::string((string *)&local_b8,"__ribosome",&local_c1);
  Polymerase::Polymerase((Polymerase *)&local_98,&local_b8,footprint,local_c0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::vector<Polymerase,_std::allocator<Polymerase>_>::push_back
            (&this->polymerases_,(value_type *)&local_98);
  this_00 = SpeciesTracker::Instance();
  std::__cxx11::string::string((string *)&local_b8,"__ribosome",&local_c1);
  SpeciesTracker::Increment(this_00,&local_b8,copy_number);
  std::__cxx11::string::~string((string *)&local_b8);
  MobileElement::~MobileElement(&local_98);
  return;
}

Assistant:

void Model::AddRibosome(int footprint, double speed, int copy_number) {
  auto pol = Polymerase("__ribosome", footprint, speed);
  polymerases_.push_back(pol);
  auto &tracker = SpeciesTracker::Instance();
  tracker.Increment("__ribosome", copy_number);
}